

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void mem_move_to_left(void *start,size_t total,size_t offset)

{
  uint uVar1;
  uint uVar2;
  uchar next;
  uchar current;
  ulong uStack_38;
  uint no_op;
  size_t n;
  size_t i;
  uchar *buf;
  size_t offset_local;
  size_t total_local;
  void *start_local;
  
  if (total != 0) {
    for (n = 0; n < total; n = n + 1) {
      uVar1 = size_greater_than(total - offset,n);
      for (uStack_38 = 0; uStack_38 < total - 1; uStack_38 = uStack_38 + 1) {
        uVar2 = if_int(uVar1,(uint)*(byte *)((long)start + uStack_38),
                       (uint)*(byte *)((long)start + uStack_38 + 1));
        *(char *)((long)start + uStack_38) = (char)uVar2;
      }
      uVar1 = if_int(uVar1,(uint)*(byte *)((long)start + (total - 1)),0);
      *(char *)((long)start + (total - 1)) = (char)uVar1;
    }
  }
  return;
}

Assistant:

static void mem_move_to_left( void *start,
                              size_t total,
                              size_t offset )
{
    volatile unsigned char *buf = start;
    size_t i, n;
    if( total == 0 )
        return;
    for( i = 0; i < total; i++ )
    {
        unsigned no_op = size_greater_than( total - offset, i );
        /* The first `total - offset` passes are a no-op. The last
         * `offset` passes shift the data one byte to the left and
         * zero out the last byte. */
        for( n = 0; n < total - 1; n++ )
        {
            unsigned char current = buf[n];
            unsigned char next = buf[n+1];
            buf[n] = if_int( no_op, current, next );
        }
        buf[total-1] = if_int( no_op, buf[total-1], 0 );
    }
}